

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O1

lzma_ret lzma_properties_size(uint32_t *size,lzma_filter *filter)

{
  lzma_ret lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(lzma_vli *)((long)&encoders[0].id + lVar2) == filter->id) {
      lVar2 = (long)&encoders[0].id + lVar2;
      goto LAB_001b69cd;
    }
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x1f8);
  lVar2 = 0;
LAB_001b69cd:
  if (lVar2 == 0) {
    return (int)((long)filter->id >> 0x3f) * -3 + LZMA_OPTIONS_ERROR;
  }
  if (*(code **)(lVar2 + 0x20) != (code *)0x0) {
    lVar1 = (**(code **)(lVar2 + 0x20))(size,filter->options);
    return lVar1;
  }
  *size = *(uint32_t *)(lVar2 + 0x28);
  return LZMA_OK;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_size(uint32_t *size, const lzma_filter *filter)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL) {
		// Unknown filter - if the Filter ID is a proper VLI,
		// return LZMA_OPTIONS_ERROR instead of LZMA_PROG_ERROR,
		// because it's possible that we just don't have support
		// compiled in for the requested filter.
		return filter->id <= LZMA_VLI_MAX
				? LZMA_OPTIONS_ERROR : LZMA_PROG_ERROR;
	}

	if (fe->props_size_get == NULL) {
		// No props_size_get() function, use props_size_fixed.
		*size = fe->props_size_fixed;
		return LZMA_OK;
	}

	return fe->props_size_get(size, filter->options);
}